

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O2

void __thiscall cmServer::ProcessRequest(cmServer *this,cmConnection *connection,string *input)

{
  _Alloc_hider __p;
  bool bVar1;
  Value *pVVar2;
  cmake *this_00;
  unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_> debug;
  allocator local_2a1;
  string local_2a0;
  Value value;
  cmServerResponse response;
  Value debugValue;
  cmServerRequest request;
  Reader reader;
  
  Json::Reader::Reader(&reader);
  Json::Value::Value(&value,nullValue);
  bVar1 = Json::Reader::parse(&reader,input,&value,true);
  if (bVar1) {
    debug._M_t.super___uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>
    ._M_t.super__Tuple_impl<0UL,_cmServer::DebugInfo_*,_std::default_delete<cmServer::DebugInfo>_>.
    super__Head_base<0UL,_cmServer::DebugInfo_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>,_true,_true>
         )(__uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>)0x0;
    pVVar2 = Json::Value::operator[](&value,"debug");
    Json::Value::Value(&debugValue,pVVar2);
    bVar1 = Json::Value::isNull(&debugValue);
    if (!bVar1) {
      std::make_unique<cmServer::DebugInfo>();
      __p = response.Type._M_dataplus;
      response.Type._M_dataplus._M_p = (pointer)0x0;
      std::__uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>::reset
                ((__uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_> *)
                 &debug,(pointer)__p._M_p);
      std::unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>::~unique_ptr
                ((unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_> *)
                 &response);
      pVVar2 = Json::Value::operator[](&debugValue,"dumpToFile");
      Json::Value::asString_abi_cxx11_(&response.Type,pVVar2);
      std::__cxx11::string::operator=
                ((string *)
                 ((long)debug._M_t.
                        super___uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmServer::DebugInfo_*,_std::default_delete<cmServer::DebugInfo>_>
                        .super__Head_base<0UL,_cmServer::DebugInfo_*,_false>._M_head_impl + 8),
                 (string *)&response);
      std::__cxx11::string::~string((string *)&response);
      pVVar2 = Json::Value::operator[](&debugValue,"showStats");
      bVar1 = Json::Value::asBool(pVVar2);
      *(bool *)debug._M_t.
               super___uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmServer::DebugInfo_*,_std::default_delete<cmServer::DebugInfo>_>
               .super__Head_base<0UL,_cmServer::DebugInfo_*,_false>._M_head_impl = bVar1;
    }
    pVVar2 = Json::Value::operator[](&value,&kTYPE_KEY_abi_cxx11_);
    Json::Value::asString_abi_cxx11_(&response.Type,pVVar2);
    pVVar2 = Json::Value::operator[](&value,&kCOOKIE_KEY_abi_cxx11_);
    Json::Value::asString_abi_cxx11_(&local_2a0,pVVar2);
    cmServerRequest::cmServerRequest(&request,this,connection,&response.Type,&local_2a0,&value);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&response);
    bVar1 = std::operator==(&request.Type,"");
    if (bVar1) {
      cmServerResponse::cmServerResponse(&response,&request);
      std::__cxx11::string::string((string *)&local_2a0,"No type given in request.",&local_2a1);
      cmServerResponse::SetError(&response,&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      WriteResponse(this,connection,&response,(DebugInfo *)0x0);
    }
    else {
      cmSystemTools::SetMessageCallback(reportMessage,&request);
      if (this->Protocol == (cmServerProtocol *)0x0) {
        SetProtocolVersion(&response,this,&request);
        WriteResponse(this,connection,&response,
                      (DebugInfo *)
                      debug._M_t.
                      super___uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmServer::DebugInfo_*,_std::default_delete<cmServer::DebugInfo>_>
                      .super__Head_base<0UL,_cmServer::DebugInfo_*,_false>._M_head_impl);
      }
      else {
        this_00 = cmServerProtocol::CMakeInstance(this->Protocol);
        cmake::SetProgressCallback(this_00,reportProgress,&request);
        (*this->Protocol->_vptr_cmServerProtocol[4])(&response,this->Protocol,&request);
        WriteResponse(this,connection,&response,
                      (DebugInfo *)
                      debug._M_t.
                      super___uniq_ptr_impl<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmServer::DebugInfo_*,_std::default_delete<cmServer::DebugInfo>_>
                      .super__Head_base<0UL,_cmServer::DebugInfo_*,_false>._M_head_impl);
      }
    }
    cmServerResponse::~cmServerResponse(&response);
    cmServerRequest::~cmServerRequest(&request);
    Json::Value::~Value(&debugValue);
    std::unique_ptr<cmServer::DebugInfo,_std::default_delete<cmServer::DebugInfo>_>::~unique_ptr
              (&debug);
  }
  else {
    std::__cxx11::string::string
              ((string *)&response,"Failed to parse JSON input.",(allocator *)&request);
    WriteParseError(this,connection,&response.Type);
    std::__cxx11::string::~string((string *)&response);
  }
  Json::Value::~Value(&value);
  Json::Reader::~Reader(&reader);
  return;
}

Assistant:

void cmServer::ProcessRequest(cmConnection* connection,
                              const std::string& input)
{
  Json::Reader reader;
  Json::Value value;
  if (!reader.parse(input, value)) {
    this->WriteParseError(connection, "Failed to parse JSON input.");
    return;
  }

  std::unique_ptr<DebugInfo> debug;
  Json::Value debugValue = value["debug"];
  if (!debugValue.isNull()) {
    debug = std::make_unique<DebugInfo>();
    debug->OutputFile = debugValue["dumpToFile"].asString();
    debug->PrintStatistics = debugValue["showStats"].asBool();
  }

  const cmServerRequest request(this, connection, value[kTYPE_KEY].asString(),
                                value[kCOOKIE_KEY].asString(), value);

  if (request.Type == "") {
    cmServerResponse response(request);
    response.SetError("No type given in request.");
    this->WriteResponse(connection, response, nullptr);
    return;
  }

  cmSystemTools::SetMessageCallback(reportMessage,
                                    const_cast<cmServerRequest*>(&request));
  if (this->Protocol) {
    this->Protocol->CMakeInstance()->SetProgressCallback(
      reportProgress, const_cast<cmServerRequest*>(&request));
    this->WriteResponse(connection, this->Protocol->Process(request),
                        debug.get());
  } else {
    this->WriteResponse(connection, this->SetProtocolVersion(request),
                        debug.get());
  }
}